

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

int yylex_NORMAL(void)

{
  LexerState *pLVar1;
  bool bVar2;
  int c;
  int iVar3;
  int32_t iVar4;
  uint uVar5;
  uint32_t uVar6;
  int iVar7;
  Symbol *name;
  undefined4 extraout_var;
  byte bVar8;
  uint32_t value;
  uint uVar9;
  uint32_t n;
  char *pcVar10;
  uint uVar11;
  byte bVar12;
  RPNCommand RVar13;
  double dVar14;
  
  iVar7 = 0xd;
LAB_0010c26c:
  c = nextChar();
  iVar3 = 6;
  switch(c) {
  case 9:
  case 0x20:
    break;
  case 10:
    goto switchD_0010c285_caseD_a;
  case 0xb:
  case 0xc:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x27:
  case 0x2e:
  case 0x3f:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5f:
    goto switchD_0010c285_caseD_b;
  case 0xd:
    handleCRLF(0xd);
    return 0xd;
  case 0x21:
    iVar7 = peek();
    if (iVar7 != 0x3d) {
      return 0xe;
    }
    shiftChar();
    return 0x15;
  case 0x22:
    bVar2 = false;
LAB_0010c7e6:
    readString(bVar2);
    return 4;
  case 0x23:
    iVar3 = peek();
    if (iVar3 == 0x22) {
      shiftChar();
      bVar2 = true;
      goto LAB_0010c7e6;
    }
    goto switchD_0010c285_caseD_b;
  case 0x24:
    bVar2 = true;
    RVar13 = RPN_ADD;
    goto LAB_0010c741;
  case 0x25:
    iVar7 = peek();
    if (iVar7 == 0x3d) {
      shiftChar();
      return 0x54;
    }
    if ((iVar7 != binDigits[0]) && (iVar7 != binDigits[1])) {
      return 0x21;
    }
    RVar13 = RPN_ADD;
    goto LAB_0010ca38;
  case 0x26:
    uVar9 = peek();
    if (uVar9 == 0x26) {
      shiftChar();
      return 0xf;
    }
    if (uVar9 == 0x3d) {
      shiftChar();
      return 0x57;
    }
    if ((uVar9 & 0xfffffff8) != 0x30) {
      return 0x1b;
    }
    RVar13 = readNumber(8,0);
    goto LAB_0010c8c8;
  case 0x28:
    return 0xb;
  case 0x29:
    return 0xc;
  case 0x2a:
    iVar7 = peek();
    if (iVar7 == 0x2a) {
      shiftChar();
      return 0x24;
    }
    if (iVar7 != 0x3d) {
      return 0x1f;
    }
    shiftChar();
    return 0x52;
  case 0x2b:
    iVar7 = peek();
    if (iVar7 != 0x3d) {
      return 0x17;
    }
    shiftChar();
    return 0x50;
  case 0x2c:
    goto switchD_0010c285_caseD_2c;
  case 0x2d:
    iVar7 = peek();
    if (iVar7 != 0x3d) {
      return 0x18;
    }
    shiftChar();
    return 0x51;
  case 0x2f:
    iVar3 = peek();
    if (iVar3 != 0x2a) {
      if (iVar3 != 0x3d) {
        return 0x20;
      }
      shiftChar();
      return 0x53;
    }
    shiftChar();
    discardBlockComment();
    break;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    RVar13 = readNumber(10,c - 0x30);
    iVar7 = peek();
    if (iVar7 != 0x2e) goto LAB_0010c8c8;
    bVar8 = 0;
    uVar9 = 1;
    uVar11 = 0;
    goto LAB_0010c3da;
  case 0x3a:
    iVar7 = peek();
    if (iVar7 != 0x2b) {
      if (iVar7 == 0x3a) {
        shiftChar();
        return 8;
      }
      if (iVar7 != 0x2d) {
        return 7;
      }
    }
    uVar6 = 0;
    do {
      shiftChar();
      uVar6 = uVar6 + 1;
      iVar3 = peek();
    } while (iVar3 == iVar7);
    sym_WriteAnonLabelName(yylval.symName,uVar6,iVar7 == 0x2d);
    return 0x4c;
  case 0x3b:
    discardComment();
    break;
  case 0x3c:
    iVar7 = peek();
    if (iVar7 == 0x3c) {
      shiftChar();
      iVar7 = peek();
      if (iVar7 != 0x3d) {
        return 0x1c;
      }
      shiftChar();
      return 0x58;
    }
    if (iVar7 != 0x3d) {
      return 0x12;
    }
    shiftChar();
    return 0x14;
  case 0x3d:
    iVar7 = peek();
    if (iVar7 != 0x3d) {
      return 0x4e;
    }
    shiftChar();
    return 0x16;
  case 0x3e:
    iVar7 = peek();
    if (iVar7 != 0x3e) {
      if (iVar7 != 0x3d) {
        return 0x11;
      }
      shiftChar();
      return 0x13;
    }
    shiftChar();
    iVar7 = peek();
    if (iVar7 != 0x3e) {
      if (iVar7 != 0x3d) {
        return 0x1d;
      }
      shiftChar();
      return 0x59;
    }
    shiftChar();
    return 0x1e;
  case 0x40:
    yylval.expr.val._0_2_ = 0x40;
    return 0x4a;
  case 0x5b:
    return 9;
  case 0x5c:
    readLineContinuation();
    break;
  case 0x5d:
    return 10;
  case 0x5e:
    iVar7 = peek();
    if (iVar7 != 0x3d) {
      return 0x1a;
    }
    shiftChar();
    return 0x56;
  case 0x60:
    iVar7 = 0;
    bVar8 = 0;
    RVar13 = RPN_ADD;
    goto LAB_0010c5fe;
  default:
    if (c == -1) {
      return 0;
    }
    if (c == 0x7c) {
      iVar7 = peek();
      if (iVar7 == 0x7c) {
        shiftChar();
        return 0x10;
      }
      if (iVar7 != 0x3d) {
        return 0x19;
      }
      shiftChar();
      return 0x55;
    }
    if (c == 0x7e) {
      return 0x22;
    }
switchD_0010c285_caseD_b:
    bVar2 = startsIdentifier(c);
    if (!bVar2) {
      if (lexerState->capturing == false) {
        printChar(c);
        error("Unknown character %s\n");
      }
      break;
    }
    iVar3 = readIdentifier((char)c);
    pLVar1 = lexerState;
    if (iVar3 != 0x4a) {
      if (iVar3 == 0x5e) {
        if (lexerState->lastToken != 0xd) {
          return 0x5e;
        }
        uVar6 = lexer_GetIFDepth();
        if (uVar6 == 0) {
          return 0x5e;
        }
        if (pLVar1->ifStack->ranIfBlock != true) {
          return 0x5e;
        }
        if (pLVar1->ifStack->reachedElseBlock == false) {
          iVar7 = yylex_SKIP_TO_ENDC();
          return iVar7;
        }
        return 0x5e;
      }
switchD_0010c285_caseD_2c:
      return iVar3;
    }
    if (((lexerState->expandStrings != true) ||
        (name = sym_FindExactSymbol(yylval.symName), name == (Symbol *)0x0)) ||
       (name->type != SYM_EQUS)) {
      if (lexerState->atLineStart != false) {
        return 0x49;
      }
      iVar7 = peek();
      return (iVar7 != 0x3a) + 0x49;
    }
    if (name->hasCallback == true) {
      iVar4 = (*(name->field_8).numCallback)();
      pcVar10 = (char *)CONCAT44(extraout_var,iVar4);
    }
    else {
      pcVar10 = (name->field_8).field_2.macro;
    }
    if (pcVar10 == (char *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                    ,0x7fe,"yylex_NORMAL");
    }
    if (*pcVar10 != '\0') {
      beginExpansion(pcVar10,false,name->name);
    }
    goto LAB_0010c26c;
  }
  lexerState->atLineStart = false;
  goto LAB_0010c26c;
LAB_0010c5fe:
  iVar3 = peek();
  uVar9 = 0;
  if ((((iVar3 == gfxDigits[0]) || (uVar9 = 1, iVar3 == gfxDigits[1])) ||
      (uVar9 = 2, iVar3 == gfxDigits[2])) || (uVar9 = 3, iVar3 == gfxDigits[3])) {
    if (bVar8 < 8) {
      RVar13 = (uVar9 & 1) + RVar13 * 2;
      iVar7 = (uVar9 >> 1) + iVar7 * 2;
    }
    bVar8 = bVar8 + (bVar8 < 9);
  }
  else if ((iVar3 != 0x5f) || (bVar8 == 0)) goto LAB_0010c666;
  shiftChar();
  goto LAB_0010c5fe;
LAB_0010c666:
  if (bVar8 == 9) {
    warning(WARNING_LARGE_CONSTANT,"Graphics constant is too long, only first 8 pixels considered\n"
           );
  }
  else if (bVar8 == 0) {
    error("Invalid graphics constant, no digits after \'`\'\n");
  }
  RVar13 = RVar13 | iVar7 << 8;
  goto LAB_0010c8c8;
LAB_0010c3da:
  iVar7 = 0;
  do {
    while( true ) {
      iVar3 = iVar7;
      shiftChar();
      uVar5 = peek();
      if (iVar3 == 0) break;
      if ((uVar5 != 0x2e) || (iVar7 = 2, iVar3 != 1)) {
        if (uVar5 - 0x3a < 0xfffffff6) {
          if (bVar8 != 0) goto LAB_0010c83e;
          pcVar10 = "Invalid fixed-point constant, no significant digits after \'q\'\n";
          goto LAB_0010c84b;
        }
        bVar8 = (bVar8 * '\n' + (char)uVar5) - 0x30;
        iVar7 = iVar3;
      }
    }
    iVar7 = 0;
  } while ((uVar5 == 0x5f) || (iVar7 = 1, (uVar5 & 0xffffffdf) == 0x51));
  bVar12 = fixPrecision;
  if (uVar5 - 0x3a < 0xfffffff6) goto joined_r0x0010c7f8;
  if ((0x2f - uVar5) / 10 < uVar9) goto LAB_0010c808;
  uVar11 = (uVar5 + uVar11 * 10) - 0x30;
  uVar9 = uVar9 * 10;
  goto LAB_0010c3da;
LAB_0010ca38:
  iVar7 = peek();
  iVar3 = 0;
  if ((iVar7 == binDigits[0]) || (iVar3 = 1, iVar7 == binDigits[1])) {
    if ((int)RVar13 < 0) {
      warning(WARNING_LARGE_CONSTANT,"Integer constant is too large\n");
    }
    RVar13 = iVar3 + RVar13 * 2;
  }
  else if (iVar7 != 0x5f) goto LAB_0010c8c8;
  shiftChar();
  goto LAB_0010ca38;
LAB_0010c741:
  iVar7 = peek();
  if (iVar7 - 0x61U < 6) {
    uVar9 = iVar7 - 0x57;
LAB_0010c761:
    if (0xfffffff < RVar13) {
      warning(WARNING_LARGE_CONSTANT,"Integer constant is too large\n");
    }
    RVar13 = RVar13 * 0x10 + uVar9;
    bVar2 = false;
  }
  else {
    if (iVar7 - 0x41U < 6) {
      uVar9 = iVar7 - 0x37;
      goto LAB_0010c761;
    }
    uVar9 = iVar7 - 0x30;
    if (uVar9 < 10) goto LAB_0010c761;
    if (iVar7 != 0x5f) {
      if (!bVar2) goto LAB_0010c8c8;
LAB_0010c90a:
      error("Invalid integer constant, no digits after \'$\'\n");
      goto LAB_0010c8c8;
    }
    if (bVar2) goto LAB_0010c90a;
  }
  shiftChar();
  goto LAB_0010c741;
LAB_0010c808:
  warning(WARNING_LARGE_CONSTANT,"Precision of fixed-point constant is too large\n",
          (ulong)(0x2f - uVar5) % 10);
  do {
    shiftChar();
    iVar7 = peek();
    bVar12 = fixPrecision;
  } while (iVar7 == 0x5f || iVar7 - 0x30U < 10);
joined_r0x0010c7f8:
  fixPrecision = bVar12;
  if (bVar8 != 0) {
LAB_0010c83e:
    bVar12 = bVar8;
    if (0x1f < bVar8) {
      pcVar10 = "Fixed-point constant precision must be between 1 and 31\n";
LAB_0010c84b:
      error(pcVar10);
      bVar12 = fixPrecision;
    }
  }
  if (RVar13 >> (-(bVar12 + 0x20) & 0x3f) != 0) {
    warning(WARNING_LARGE_CONSTANT,"Magnitude of fixed-point constant is too large\n");
  }
  dVar14 = ldexp(1.0,(uint)bVar12);
  dVar14 = round(dVar14 * ((double)uVar11 / (double)uVar9));
  RVar13 = RVar13 << (bVar12 & 0x1f) | (RPNCommand)(long)dVar14;
LAB_0010c8c8:
  yylval.compoundEqual = RVar13;
  iVar7 = 3;
switchD_0010c285_caseD_a:
  return iVar7;
}

Assistant:

static int yylex_NORMAL(void)
{
	for (;;) {
		int c = nextChar();

		switch (c) {
		// Ignore whitespace and comments

		case ';':
			discardComment();
			// fallthrough
		case ' ':
		case '\t':
			break;

		// Handle unambiguous single-char tokens

		case '~':
			return T_OP_NOT;

		case '@':
			yylval.symName[0] = '@';
			yylval.symName[1] = '\0';
			return T_ID;

		case '[':
			return T_LBRACK;
		case ']':
			return T_RBRACK;
		case '(':
			return T_LPAREN;
		case ')':
			return T_RPAREN;
		case ',':
			return T_COMMA;

		// Handle ambiguous 1- or 2-char tokens

		case '+': // Either += or ADD
			if (peek() == '=') {
				shiftChar();
				return T_POP_ADDEQ;
			}
			return T_OP_ADD;

		case '-': // Either -= or SUB
			if (peek() == '=') {
				shiftChar();
				return T_POP_SUBEQ;
			}
			return T_OP_SUB;

		case '*': // Either *=, MUL, or EXP
			switch (peek()) {
			case '=':
				shiftChar();
				return T_POP_MULEQ;
			case '*':
				shiftChar();
				return T_OP_EXP;
			default:
				return T_OP_MUL;
			}

		case '/': // Either /=, DIV, or a block comment
			switch (peek()) {
			case '=':
				shiftChar();
				return T_POP_DIVEQ;
			case '*':
				shiftChar();
				discardBlockComment();
				break;
			default:
				return T_OP_DIV;
			}
			break;

		case '|': // Either |=, binary OR, or logical OR
			switch (peek()) {
			case '=':
				shiftChar();
				return T_POP_OREQ;
			case '|':
				shiftChar();
				return T_OP_LOGICOR;
			default:
				return T_OP_OR;
			}

		case '^': // Either ^= or XOR
			if (peek() == '=') {
				shiftChar();
				return T_POP_XOREQ;
			}
			return T_OP_XOR;

		case '=': // Either assignment or EQ
			if (peek() == '=') {
				shiftChar();
				return T_OP_LOGICEQU;
			}
			return T_POP_EQUAL;

		case '!': // Either a NEQ or negation
			if (peek() == '=') {
				shiftChar();
				return T_OP_LOGICNE;
			}
			return T_OP_LOGICNOT;

		// Handle ambiguous 1-, 2-, or 3-char tokens

		case '<': // Either <<=, LT, LTE, or left shift
			switch (peek()) {
			case '=':
				shiftChar();
				return T_OP_LOGICLE;
			case '<':
				shiftChar();
				if (peek() == '=') {
					shiftChar();
					return T_POP_SHLEQ;
				}
				return T_OP_SHL;
			default:
				return T_OP_LOGICLT;
			}

		case '>': // Either >>=, GT, GTE, or either kind of right shift
			switch (peek()) {
			case '=':
				shiftChar();
				return T_OP_LOGICGE;
			case '>':
				shiftChar();
				switch (peek()) {
				case '=':
					shiftChar();
					return T_POP_SHREQ;
				case '>':
					shiftChar();
					return T_OP_USHR;
				default:
					return T_OP_SHR;
				}
			default:
				return T_OP_LOGICGT;
			}

		case ':': // Either :, ::, or an anonymous label ref
			c = peek();
			switch (c) {
			case ':':
				shiftChar();
				return T_DOUBLE_COLON;
			case '+':
			case '-':
				readAnonLabelRef(c);
				return T_ANON;
			default:
				return T_COLON;
			}

		// Handle numbers

		case '0': // Decimal or fixed-point number
		case '1':
		case '2':
		case '3':
		case '4':
		case '5':
		case '6':
		case '7':
		case '8':
		case '9': {
			uint32_t n = readNumber(10, c - '0');

			if (peek() == '.') {
				shiftChar();
				n = readFractionalPart(n);
			}
			yylval.constValue = n;
			return T_NUMBER;
		}

		case '&': // Either &=, binary AND, logical AND, or an octal constant
			c = peek();
			if (c == '=') {
				shiftChar();
				return T_POP_ANDEQ;
			} else if (c == '&') {
				shiftChar();
				return T_OP_LOGICAND;
			} else if (c >= '0' && c <= '7') {
				yylval.constValue = readNumber(8, 0);
				return T_NUMBER;
			}
			return T_OP_AND;

		case '%': // Either %=, MOD, or a binary constant
			c = peek();
			if (c == '=') {
				shiftChar();
				return T_POP_MODEQ;
			} else if (c == binDigits[0] || c == binDigits[1]) {
				yylval.constValue = readBinaryNumber();
				return T_NUMBER;
			}
			return T_OP_MOD;

		case '$': // Hex constant
			yylval.constValue = readHexNumber();
			return T_NUMBER;

		case '`': // Gfx constant
			yylval.constValue = readGfxConstant();
			return T_NUMBER;

		// Handle strings

		case '"':
			readString(false);
			return T_STRING;

		// Handle newlines and EOF

		case '\r':
			handleCRLF(c);
			// fallthrough
		case '\n':
			return T_NEWLINE;

		case EOF:
			return T_EOF;

		// Handle line continuations

		case '\\':
			// Macro args were handled by `peek`, and character escapes do not exist
			// outside of string literals, so this must be a line continuation.
			readLineContinuation();
			break;

		// Handle raw strings... or fall through if '#' is not followed by '"'

		case '#':
			if (peek() == '"') {
				shiftChar();
				readString(true);
				return T_STRING;
			}
			// fallthrough

		// Handle identifiers... or report garbage characters

		default:
			if (startsIdentifier(c)) {
				int tokenType = readIdentifier(c);

				// An ELIF after a taken IF needs to not evaluate its condition
				if (tokenType == T_POP_ELIF && lexerState->lastToken == T_NEWLINE
				 && lexer_GetIFDepth() > 0 && lexer_RanIFBlock()
				 && !lexer_ReachedELSEBlock())
					return yylex_SKIP_TO_ENDC();

				// If a keyword, don't try to expand
				if (tokenType != T_ID && tokenType != T_LOCAL_ID)
					return tokenType;

				// Local symbols cannot be string expansions
				if (tokenType == T_ID && lexerState->expandStrings) {
					// Attempt string expansion
					struct Symbol const *sym = sym_FindExactSymbol(yylval.symName);

					if (sym && sym->type == SYM_EQUS) {
						char const *s = sym_GetStringValue(sym);

						assert(s);
						if (s[0])
							beginExpansion(s, false, sym->name);
						continue; // Restart, reading from the new buffer
					}
				}

				if (tokenType == T_ID && (lexerState->atLineStart || peek() == ':'))
					return T_LABEL;

				return tokenType;
			}

			// Do not report weird characters when capturing, it'll be done later
			if (!lexerState->capturing) {
				// TODO: try to group reportings
				error("Unknown character %s\n", printChar(c));
			}
		}
		lexerState->atLineStart = false;
	}
}